

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

string * common_sampler_type_to_str_abi_cxx11_
                   (string *__return_storage_ptr__,common_sampler_type cnstr)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(cnstr) {
  case COMMON_SAMPLER_TYPE_DRY:
    pcVar2 = "dry";
    pcVar1 = "";
    break;
  case COMMON_SAMPLER_TYPE_TOP_K:
    pcVar2 = "top_k";
    pcVar1 = "";
    break;
  case COMMON_SAMPLER_TYPE_TOP_P:
    pcVar2 = "top_p";
    pcVar1 = "";
    break;
  case COMMON_SAMPLER_TYPE_MIN_P:
    pcVar2 = "min_p";
    pcVar1 = "";
    break;
  default:
    pcVar1 = "";
    pcVar2 = pcVar1;
    break;
  case COMMON_SAMPLER_TYPE_TYPICAL_P:
    pcVar2 = "typ_p";
    pcVar1 = "";
    break;
  case COMMON_SAMPLER_TYPE_TEMPERATURE:
    pcVar2 = "temperature";
    pcVar1 = "";
    break;
  case COMMON_SAMPLER_TYPE_XTC:
    pcVar2 = "xtc";
    pcVar1 = "";
    break;
  case COMMON_SAMPLER_TYPE_INFILL:
    pcVar2 = "infill";
    pcVar1 = "";
    break;
  case COMMON_SAMPLER_TYPE_PENALTIES:
    pcVar2 = "penalties";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string common_sampler_type_to_str(enum common_sampler_type cnstr) {
    switch (cnstr) {
        case COMMON_SAMPLER_TYPE_DRY:         return "dry";
        case COMMON_SAMPLER_TYPE_TOP_K:       return "top_k";
        case COMMON_SAMPLER_TYPE_TYPICAL_P:   return "typ_p";
        case COMMON_SAMPLER_TYPE_TOP_P:       return "top_p";
        case COMMON_SAMPLER_TYPE_MIN_P:       return "min_p";
        case COMMON_SAMPLER_TYPE_TEMPERATURE: return "temperature";
        case COMMON_SAMPLER_TYPE_XTC:         return "xtc";
        case COMMON_SAMPLER_TYPE_INFILL:      return "infill";
        case COMMON_SAMPLER_TYPE_PENALTIES:   return "penalties";
        default : return "";
    }
}